

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::InputFile::rawTileData
          (InputFile *this,int *dx,int *dy,int *lx,int *ly,char **pixelData,int *pixelDataSize)

{
  element_type *peVar1;
  undefined8 uVar2;
  stringstream _iex_replace_s;
  BaseExc *e;
  stringstream _iex_throw_s;
  char **in_stack_00000208;
  int *in_stack_00000210;
  int *in_stack_00000218;
  int *in_stack_00000220;
  int *in_stack_00000228;
  TiledInputFile *in_stack_00000230;
  int *in_stack_00000240;
  stringstream *in_stack_fffffffffffffc68;
  ArgExc *in_stack_fffffffffffffc70;
  stringstream local_1c8 [16];
  ostream local_1b8 [440];
  
  peVar1 = std::
           __shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1c9225);
  if (peVar1->_storage != EXR_STORAGE_TILED) {
    peVar1 = std::
             __shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1c923d);
    if (peVar1->_storage != EXR_STORAGE_DEEP_TILED) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1c8);
      std::operator<<(local_1b8,"Tried to read a raw tile from a scanline-based image.");
      uVar2 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
  }
  std::__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1c93f1);
  std::unique_ptr<Imf_3_3::TiledInputFile,_std::default_delete<Imf_3_3::TiledInputFile>_>::
  operator->((unique_ptr<Imf_3_3::TiledInputFile,_std::default_delete<Imf_3_3::TiledInputFile>_> *)
             0x1c93fd);
  TiledInputFile::rawTileData
            (in_stack_00000230,in_stack_00000228,in_stack_00000220,in_stack_00000218,
             in_stack_00000210,in_stack_00000208,in_stack_00000240);
  return;
}

Assistant:

void
InputFile::rawTileData (
    int&         dx,
    int&         dy,
    int&         lx,
    int&         ly,
    const char*& pixelData,
    int&         pixelDataSize)
{
    try
    {
        if (_data->_storage != EXR_STORAGE_TILED &&
            _data->_storage != EXR_STORAGE_DEEP_TILED)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Tried to read a raw tile "
                "from a scanline-based image.");
        }

        _data->_tFile->rawTileData (dx, dy, lx, ly, pixelData, pixelDataSize);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error reading tile data from image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}